

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpNotify(UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,char **VarName_const,
              char **NewVal_const,int cVariables)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  char **NewVal;
  char **VarName;
  char *ServName;
  char *DevID;
  Handle_Info *pHStack_40;
  int retVal;
  Handle_Info *SInfo;
  char **ppcStack_30;
  int cVariables_local;
  char **NewVal_const_local;
  char **VarName_const_local;
  char *ServName_const_local;
  char *DevID_const_local;
  UpnpDevice_Handle Hnd_local;
  
  pHStack_40 = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo._4_4_ = cVariables;
    ppcStack_30 = NewVal_const;
    NewVal_const_local = VarName_const;
    VarName_const_local = (char **)ServName_const;
    ServName_const_local = DevID_const;
    DevID_const_local._0_4_ = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa3d,"Inside UpnpNotify\n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0xa3f);
    UVar1 = GetHandleInfo((UpnpDevice_Handle)DevID_const_local,&stack0xffffffffffffffc0);
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa48);
        DevID_const_local._4_4_ = -0x65;
      }
      else if (ServName_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa4c);
        DevID_const_local._4_4_ = -0x65;
      }
      else if (((VarName_const == (char **)0x0) || (NewVal_const == (char **)0x0)) ||
              (SInfo._4_4_ < 0)) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa50);
        DevID_const_local._4_4_ = -0x65;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa54);
        iVar2 = genaNotifyAll((UpnpDevice_Handle)DevID_const_local,DevID_const,ServName_const,
                              VarName_const,NewVal_const,SInfo._4_4_);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa58,"Exiting UpnpNotify\n");
        DevID_const_local._4_4_ = iVar2;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xa44);
      DevID_const_local._4_4_ = -100;
    }
  }
  else {
    DevID_const_local._4_4_ = -0x74;
  }
  return DevID_const_local._4_4_;
}

Assistant:

int UpnpNotify(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	const char **VarName_const,
	const char **NewVal_const,
	int cVariables)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;
	char **VarName = (char **)VarName_const;
	char **NewVal = (char **)NewVal_const;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpNotify\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (VarName == NULL || NewVal == NULL || cVariables < 0) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}

	HandleUnlock(__FILE__, __LINE__);
	retVal = genaNotifyAll(
		Hnd, DevID, ServName, VarName, NewVal, cVariables);

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpNotify\n");

	return retVal;
}